

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O3

void TTD::NSSnapObjects::AssertSnapEquiv_SnapArrayInfoCore<void*>
               (SnapArrayInfoBlock<void_*> *arrayInfo1,SnapArrayInfoBlock<void_*> *arrayInfo2,
               TTDCompareMap *compareMap)

{
  SnapArrayInfoBlock<void_*> **segment;
  uint32 *pos;
  SnapArrayInfoBlock<void_*> **index;
  SnapArrayInfoBlock<void_*> *local_50;
  SnapArrayInfoBlock<void_*> *arrayInfo2_local;
  SnapArrayInfoBlock<void_*> *arrayInfo1_local;
  uint32 index1;
  uint32 index2;
  uint32 pos1;
  uint32 pos2;
  
  if (arrayInfo1 == (SnapArrayInfoBlock<void_*> *)0x0) {
    arrayInfo1_local._0_4_ = 0;
  }
  else {
    arrayInfo1_local._0_4_ = arrayInfo1->FirstIndex;
  }
  index1 = 0;
  local_50 = arrayInfo2;
  arrayInfo2_local = arrayInfo1;
  if (arrayInfo2 == (SnapArrayInfoBlock<void_*> *)0x0) {
    arrayInfo1_local._4_4_ = 0;
    index2 = 0;
  }
  else {
    arrayInfo1_local._4_4_ = arrayInfo2->FirstIndex;
    index2 = 0;
    if (arrayInfo1 != (SnapArrayInfoBlock<void_*> *)0x0) {
      do {
        if ((uint32)arrayInfo1_local < arrayInfo1_local._4_4_) {
          TTDCompareMap::DiagnosticAssert
                    (compareMap,arrayInfo2_local->ArrayValidTags[index1] == '\0');
          segment = &arrayInfo2_local;
          pos = &index1;
          index = &arrayInfo1_local;
        }
        else {
          if (arrayInfo1_local._4_4_ < (uint32)arrayInfo1_local) {
            TTDCompareMap::DiagnosticAssert(compareMap,local_50->ArrayValidTags[index2] == '\0');
          }
          else {
            TTDCompareMap::DiagnosticAssert
                      (compareMap,
                       arrayInfo2_local->ArrayValidTags[index1] == local_50->ArrayValidTags[index2])
            ;
            if (arrayInfo2_local->ArrayValidTags[index1] != '\0') {
              SnapArrayInfo_EquivValue
                        (arrayInfo2_local->ArrayRangeContents[index1],
                         local_50->ArrayRangeContents[index2],compareMap,(uint32)arrayInfo1_local);
            }
            AdvanceArrayIndex_SnapArrayInfoCompare<void*>
                      ((uint32 *)&arrayInfo1_local,&index1,&arrayInfo2_local);
          }
          index = (SnapArrayInfoBlock<void_*> **)((long)&arrayInfo1_local + 4);
          pos = &index2;
          segment = &local_50;
        }
        AdvanceArrayIndex_SnapArrayInfoCompare<void*>((uint32 *)index,pos,segment);
      } while ((arrayInfo2_local != (SnapArrayInfoBlock<void_*> *)0x0) &&
              (local_50 != (SnapArrayInfoBlock<void_*> *)0x0));
    }
  }
  if (arrayInfo2_local != (SnapArrayInfoBlock<void_*> *)0x0) {
    do {
      TTDCompareMap::DiagnosticAssert(compareMap,arrayInfo2_local->ArrayValidTags[index1] == '\0');
      AdvanceArrayIndex_SnapArrayInfoCompare<void*>
                ((uint32 *)&arrayInfo1_local,&index1,&arrayInfo2_local);
    } while (arrayInfo2_local != (SnapArrayInfoBlock<void_*> *)0x0);
  }
  return;
}

Assistant:

void AssertSnapEquiv_SnapArrayInfoCore(const SnapArrayInfoBlock<T>* arrayInfo1, const SnapArrayInfoBlock<T>* arrayInfo2, TTDCompareMap& compareMap)
        {
            uint32 index1 = (arrayInfo1 != nullptr) ? arrayInfo1->FirstIndex : 0;
            uint32 pos1 = 0;

            uint32 index2 = (arrayInfo2 != nullptr) ? arrayInfo2->FirstIndex : 0;
            uint32 pos2 = 0;

            while(arrayInfo1 != nullptr && arrayInfo2 != nullptr)
            {
                if(index1 < index2)
                {
                    compareMap.DiagnosticAssert(!arrayInfo1->ArrayValidTags[pos1]);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
                }
                else if(index1 > index2)
                {
                    compareMap.DiagnosticAssert(!arrayInfo2->ArrayValidTags[pos2]);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
                }
                else
                {
                    compareMap.DiagnosticAssert(arrayInfo1->ArrayValidTags[pos1] == arrayInfo2->ArrayValidTags[pos2]);
                    if(arrayInfo1->ArrayValidTags[pos1])
                    {
                        SnapArrayInfo_EquivValue(arrayInfo1->ArrayRangeContents[pos1], arrayInfo2->ArrayRangeContents[pos2], compareMap, index1);
                    }

                    AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
                }
            }

            //make sure any remaining entries an empty
            while(arrayInfo1 != nullptr)
            {
                compareMap.DiagnosticAssert(!arrayInfo1->ArrayValidTags[pos1]);
                AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
            }

            while(arrayInfo1 != nullptr)
            {
                compareMap.DiagnosticAssert(!arrayInfo2->ArrayValidTags[pos2]);
                AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
            }
        }